

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

Expression *
slang::ast::ConversionExpression::fromSyntax
          (Compilation *comp,CastExpressionSyntax *syntax,ASTContext *context,Type *assignmentTarget
          )

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange range_03;
  SourceRange range_04;
  SourceRange range_05;
  SourceRange range_06;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceRange sourceRange;
  SourceRange range_07;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  optional<int> value;
  SourceRange opRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  int *piVar5;
  ParenthesizedExpressionSyntax *pPVar6;
  ConversionExpression *this;
  long in_RCX;
  Compilation *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  SourceRange SVar7;
  Type *propagatedType;
  anon_class_16_2_82e9fe5a isDifferentTypedef;
  anon_class_8_1_38113ba9 isGenvar;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  anon_class_32_4_0791e916 result;
  Diagnostic *diag;
  bitwidth_t width;
  optional<int> val;
  Expression *operand;
  Type *type;
  Expression *targetExpr;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  Compilation *in_stack_fffffffffffffce0;
  Type *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  bitwidth_t in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcf8;
  ConversionKind in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd04;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar8;
  _Storage<int,_true> in_stack_fffffffffffffd0c;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd10;
  DiagCode in_stack_fffffffffffffd14;
  Compilation *in_stack_fffffffffffffd18;
  SourceLocation SVar10;
  Type *in_stack_fffffffffffffd28;
  Diagnostic *in_stack_fffffffffffffd30;
  SourceLocation in_stack_fffffffffffffd38;
  SourceLocation in_stack_fffffffffffffd40;
  SourceLocation in_stack_fffffffffffffd48;
  ConversionKind in_stack_fffffffffffffd50;
  Type *in_stack_fffffffffffffd90;
  Compilation *in_stack_fffffffffffffd98;
  bitwidth_t width_00;
  Compilation *pCVar11;
  bitmask<slang::ast::IntegralFlags> flags;
  not_null<const_slang::ast::Type_*> in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdf0 [16];
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ASTContext *in_stack_fffffffffffffea0;
  ExpressionSyntax *in_stack_fffffffffffffea8;
  Compilation *in_stack_fffffffffffffeb0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffeb8;
  bitmask<slang::ast::ASTFlags> local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  undefined8 local_90;
  undefined8 local_88;
  _Optional_payload_base<int> local_7c;
  bitmask<slang::ast::EvalFlags> local_71;
  _Optional_payload_base<int> local_70;
  bitmask<slang::ast::ASTFlags> local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_4c;
  Expression *local_48;
  SourceLocation local_40;
  bitmask<slang::ast::ASTFlags> local_38;
  int *local_30;
  long local_28;
  Compilation *local_20;
  long local_18;
  undefined8 local_10;
  ConversionExpression *local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9eb158);
  pCVar11 = local_20;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AllowDataType);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)pCVar11,(socklen_t)local_38.m_bits);
  local_30 = (int *)CONCAT44(extraout_var,iVar2);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffce0);
  if (bVar1) {
    pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                 (Expression *)
                                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    return pEVar4;
  }
  local_40 = (SourceLocation)Compilation::getErrorType(local_10);
  if (*local_30 == 0x17) {
    local_40 = (SourceLocation)
               not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9eb20f);
    bVar1 = Type::isSimpleType((Type *)local_40);
    if ((((!bVar1) && (bVar1 = Type::isError((Type *)0x9eb239), !bVar1)) &&
        (bVar1 = Type::isString((Type *)0x9eb24e), !bVar1)) &&
       (pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9eb267),
       (pEVar3->super_SyntaxNode).kind != TypeReference)) {
      local_4c = 0x200007;
      local_60 = *(undefined8 *)(local_30 + 8);
      local_58 = *(undefined8 *)(local_30 + 10);
      sourceRange.startLoc._4_2_ = in_stack_fffffffffffffd04;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffd00;
      sourceRange.startLoc._6_1_ = in_stack_fffffffffffffd06;
      sourceRange.startLoc._7_1_ = in_stack_fffffffffffffd07;
      sourceRange.endLoc._0_4_ = in_stack_fffffffffffffd08;
      sourceRange.endLoc._4_4_ = in_stack_fffffffffffffd0c._M_value;
      ASTContext::addDiag((ASTContext *)
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                          in_stack_fffffffffffffd14,sourceRange);
      ast::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                   (Expression *)
                                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      return pEVar4;
    }
    not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
              ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x9eb30f);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_68,StreamingAllowed);
    local_48 = Expression::create(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                  in_stack_fffffffffffffea0,in_stack_fffffffffffffeb8,
                                  (Type *)CONCAT44(in_stack_fffffffffffffe9c,
                                                   in_stack_fffffffffffffe98));
    bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffce0);
    if (bVar1) {
      pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                   (Expression *)
                                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      return pEVar4;
    }
LAB_009eb75f:
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9eb7c0);
    bVar1 = Type::isCastCompatible
                      ((Type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       (Type *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    if (bVar1) {
      SVar10 = local_40;
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9ebc37);
      bVar1 = Type::isMatching((Type *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      if ((((bVar1) &&
           (bVar1 = fromSyntax::anon_class_8_1_38113ba9::operator()
                              ((anon_class_8_1_38113ba9 *)in_stack_fffffffffffffce8), !bVar1)) &&
          (bVar1 = fromSyntax::anon_class_16_2_82e9fe5a::operator()
                             ((anon_class_16_2_82e9fe5a *)
                              CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)), !bVar1
          )) && ((((local_28 != 0 &&
                   (bVar1 = Type::isMatching((Type *)in_stack_fffffffffffffd98,
                                             in_stack_fffffffffffffd90), bVar1)) &&
                  (local_48->kind != ConditionalOp)) ||
                 (bVar1 = actuallyNeededCast((Type *)in_stack_fffffffffffffd18,
                                             (Expression *)
                                             CONCAT44(in_stack_fffffffffffffd14,
                                                      in_stack_fffffffffffffd10)), !bVar1)))) {
        in_stack_fffffffffffffd10 = SUB84(local_20,0);
        in_stack_fffffffffffffd14 = SUB84((ulong)local_20 >> 0x20,0);
        parsing::Token::location((Token *)(local_18 + 0x20));
        code_02.code._0_1_ = in_stack_fffffffffffffd06;
        code_02.subsystem = in_stack_fffffffffffffd04;
        code_02.code._1_1_ = in_stack_fffffffffffffd07;
        location_01._4_4_ = in_stack_fffffffffffffcfc;
        location_01._0_4_ = in_stack_fffffffffffffcf8;
        in_stack_fffffffffffffd18 =
             (Compilation *)
             ASTContext::addDiag((ASTContext *)
                                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                 code_02,location_01);
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0x9ebd29);
        ast::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        range_05.endLoc._0_4_ = in_stack_fffffffffffffcf0;
        range_05.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
        range_05.endLoc._4_4_ = in_stack_fffffffffffffcf4;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_05);
        range_06.endLoc._0_4_ = in_stack_fffffffffffffcf0;
        range_06.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
        range_06.endLoc._4_4_ = in_stack_fffffffffffffcf4;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_06);
      }
      uVar8 = local_40._0_4_;
      uVar9 = local_40._4_4_;
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x9ebdc4);
      bVar1 = Type::isAssignmentCompatible
                        ((Type *)in_stack_fffffffffffffd38,(Type *)in_stack_fffffffffffffd30);
      if (bVar1) {
        bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffce0);
        if (bVar1) {
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0x9ebe0e);
          bVar1 = Type::isNumeric((Type *)in_stack_fffffffffffffce0);
          if (bVar1) {
            in_stack_fffffffffffffd00 = local_40._0_4_;
            in_stack_fffffffffffffd04 = local_40._4_2_;
            in_stack_fffffffffffffd06 = local_40._6_1_;
            in_stack_fffffffffffffd07 = local_40._7_1_;
            not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x9ebe47);
            OpInfo::binaryType(in_stack_fffffffffffffd18,
                               (Type *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10)
                               ,(Type *)CONCAT44(uVar9,uVar8),(bool)in_stack_fffffffffffffd07,
                               (bool)in_stack_fffffffffffffd06);
            in_stack_fffffffffffffcfc = local_10._4_4_;
          }
        }
        parsing::Token::range
                  ((Token *)CONCAT17(in_stack_fffffffffffffd07,
                                     CONCAT16(in_stack_fffffffffffffd06,
                                              CONCAT24(in_stack_fffffffffffffd04,
                                                       in_stack_fffffffffffffd00))));
        opRange.endLoc = in_stack_fffffffffffffd40;
        opRange.startLoc = in_stack_fffffffffffffd38;
        Expression::contextDetermined
                  ((ASTContext *)in_stack_fffffffffffffd30,(Expression **)in_stack_fffffffffffffd28,
                   (Expression *)SVar10,(Type *)in_stack_fffffffffffffd18,opRange,
                   in_stack_fffffffffffffd50);
        if (local_48->kind == Conversion) {
          this = Expression::as<slang::ast::ConversionExpression>(local_48);
          bVar1 = isImplicit(this);
          if (!bVar1) {
            SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd30);
            (local_48->sourceRange).startLoc = SVar7.startLoc;
            (local_48->sourceRange).endLoc = SVar7.endLoc;
            not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                      ((not_null<const_slang::ast::Type_*> *)&stack0xfffffffffffffde8,
                       (Type **)&local_40);
            (local_48->type).ptr = in_stack_fffffffffffffde8.ptr;
            return local_48;
          }
        }
      }
      else {
        Expression::selfDetermined
                  ((ASTContext *)in_stack_fffffffffffffd30,(Expression **)in_stack_fffffffffffffd28)
        ;
      }
      local_8 = fromSyntax::anon_class_32_4_0791e916::operator()
                          ((anon_class_32_4_0791e916 *)
                           CONCAT17(in_stack_fffffffffffffd07,
                                    CONCAT16(in_stack_fffffffffffffd06,
                                             CONCAT24(in_stack_fffffffffffffd04,
                                                      in_stack_fffffffffffffd00))),
                           in_stack_fffffffffffffcfc);
    }
    else {
      sourceRange_00.endLoc = in_stack_fffffffffffffd48;
      sourceRange_00.startLoc = in_stack_fffffffffffffd40;
      bVar1 = Bitstream::checkClassAccess
                        ((Type *)in_stack_fffffffffffffd38,(ASTContext *)in_stack_fffffffffffffd30,
                         sourceRange_00);
      if (bVar1) {
        if (local_48->kind == Streaming) {
          Expression::as<slang::ast::StreamingConcatenationExpression>(local_48);
          bVar1 = Bitstream::isBitstreamCast
                            (in_stack_fffffffffffffce8,
                             (StreamingConcatenationExpression *)in_stack_fffffffffffffce0);
          if (!bVar1) {
            parsing::Token::location((Token *)(local_18 + 0x20));
            code_00.code._0_1_ = in_stack_fffffffffffffd06;
            code_00.subsystem = in_stack_fffffffffffffd04;
            code_00.code._1_1_ = in_stack_fffffffffffffd07;
            location._4_4_ = in_stack_fffffffffffffcfc;
            location._0_4_ = in_stack_fffffffffffffcf8;
            ASTContext::addDiag((ASTContext *)
                                CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                code_00,location);
            ast::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
            range_01.endLoc._0_4_ = in_stack_fffffffffffffcf0;
            range_01.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
            range_01.endLoc._4_4_ = in_stack_fffffffffffffcf4;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_01);
            range_02.endLoc._0_4_ = in_stack_fffffffffffffcf0;
            range_02.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
            range_02.endLoc._4_4_ = in_stack_fffffffffffffcf4;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_02);
            fromSyntax::anon_class_32_4_0791e916::operator()
                      ((anon_class_32_4_0791e916 *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,
                                         CONCAT24(in_stack_fffffffffffffd04,
                                                  in_stack_fffffffffffffd00))),
                       in_stack_fffffffffffffcfc);
            pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                         (Expression *)
                                         CONCAT44(in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8));
            return pEVar4;
          }
        }
        else {
          SVar10 = local_40;
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x9eb9e6);
          bVar1 = Type::isBitstreamCastable
                            ((Type *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                             (Type *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          if (!bVar1) {
            parsing::Token::location((Token *)(local_18 + 0x20));
            code_01.code._0_1_ = in_stack_fffffffffffffd06;
            code_01.subsystem = in_stack_fffffffffffffd04;
            code_01.code._1_1_ = in_stack_fffffffffffffd07;
            location_00._4_4_ = in_stack_fffffffffffffcfc;
            location_00._0_4_ = in_stack_fffffffffffffcf8;
            ASTContext::addDiag((ASTContext *)
                                CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                code_01,location_00);
            not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x9eba6d);
            ast::operator<<((Diagnostic *)local_20,in_stack_fffffffffffffd28);
            ast::operator<<((Diagnostic *)local_20,in_stack_fffffffffffffd28);
            range_03.endLoc._0_4_ = in_stack_fffffffffffffcf0;
            range_03.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
            range_03.endLoc._4_4_ = in_stack_fffffffffffffcf4;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_03);
            range_04.endLoc._0_4_ = in_stack_fffffffffffffcf0;
            range_04.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
            range_04.endLoc._4_4_ = in_stack_fffffffffffffcf4;
            Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_04);
            fromSyntax::anon_class_32_4_0791e916::operator()
                      ((anon_class_32_4_0791e916 *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,
                                         CONCAT24(in_stack_fffffffffffffd04,
                                                  in_stack_fffffffffffffd00))),
                       in_stack_fffffffffffffcfc);
            pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                         (Expression *)
                                         CONCAT44(in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8));
            return pEVar4;
          }
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x9ebb49);
          sourceRange_01.endLoc = SVar10;
          sourceRange_01.startLoc = in_stack_fffffffffffffd40;
          bVar1 = Bitstream::checkClassAccess
                            ((Type *)in_stack_fffffffffffffd38,
                             (ASTContext *)in_stack_fffffffffffffd30,sourceRange_01);
          if (!bVar1) {
            fromSyntax::anon_class_32_4_0791e916::operator()
                      ((anon_class_32_4_0791e916 *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,
                                         CONCAT24(in_stack_fffffffffffffd04,
                                                  in_stack_fffffffffffffd00))),
                       in_stack_fffffffffffffcfc);
            pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                         (Expression *)
                                         CONCAT44(in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8));
            return pEVar4;
          }
        }
        local_8 = fromSyntax::anon_class_32_4_0791e916::operator()
                            ((anon_class_32_4_0791e916 *)
                             CONCAT17(in_stack_fffffffffffffd07,
                                      CONCAT16(in_stack_fffffffffffffd06,
                                               CONCAT24(in_stack_fffffffffffffd04,
                                                        in_stack_fffffffffffffd00))),
                             in_stack_fffffffffffffcfc);
      }
      else {
        fromSyntax::anon_class_32_4_0791e916::operator()
                  ((anon_class_32_4_0791e916 *)
                   CONCAT17(in_stack_fffffffffffffd07,
                            CONCAT16(in_stack_fffffffffffffd06,
                                     CONCAT24(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)))
                   ,in_stack_fffffffffffffcfc);
        local_8 = (ConversionExpression *)
                  Expression::badExpr(in_stack_fffffffffffffce0,
                                      (Expression *)
                                      CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
        ;
      }
    }
  }
  else {
    pCVar11 = local_20;
    memset(&local_71,0,1);
    flags.m_bits = (underlying_type)((ulong)pCVar11 >> 0x38);
    bitmask<slang::ast::EvalFlags>::bitmask(&local_71);
    local_70 = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         (in_stack_fffffffffffffdf0._0_8_,
                          (Expression *)in_stack_fffffffffffffde8.ptr,
                          (bitmask<slang::ast::EvalFlags>)in_stack_fffffffffffffdf0[0xf]);
    bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x9eb417);
    if (bVar1) {
      local_7c = local_70;
      local_90 = *(undefined8 *)(local_30 + 8);
      local_88 = *(undefined8 *)(local_30 + 10);
      value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_
           = in_stack_fffffffffffffd10;
      value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
      _M_payload._M_value = in_stack_fffffffffffffd0c._M_value;
      SVar7.startLoc._4_4_ = in_stack_fffffffffffffcfc;
      SVar7.startLoc._0_4_ = in_stack_fffffffffffffcf8;
      SVar7.endLoc._0_4_ = in_stack_fffffffffffffd00;
      SVar7.endLoc._4_2_ = in_stack_fffffffffffffd04;
      SVar7.endLoc._6_1_ = in_stack_fffffffffffffd06;
      SVar7.endLoc._7_1_ = in_stack_fffffffffffffd07;
      bVar1 = ASTContext::requireGtZero
                        ((ASTContext *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)
                         ,value,SVar7);
      if (bVar1) {
        piVar5 = std::optional<int>::operator*((optional<int> *)0x9eb4a1);
        local_94 = *piVar5;
        local_a8 = *(undefined8 *)(local_30 + 8);
        local_a0 = *(undefined8 *)(local_30 + 10);
        range_07.startLoc._4_2_ = in_stack_fffffffffffffd04;
        range_07.startLoc._0_4_ = in_stack_fffffffffffffd00;
        range_07.startLoc._6_1_ = in_stack_fffffffffffffd06;
        range_07.startLoc._7_1_ = in_stack_fffffffffffffd07;
        range_07.endLoc._0_4_ = in_stack_fffffffffffffd08;
        range_07.endLoc._4_4_ = in_stack_fffffffffffffd0c._M_value;
        bVar1 = ASTContext::requireValidBitWidth
                          ((ASTContext *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                           in_stack_fffffffffffffcf4,range_07);
        if (!bVar1) {
          pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                       (Expression *)
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                      );
          return pEVar4;
        }
        in_stack_fffffffffffffd98 = local_10;
        pPVar6 = not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
                           ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x9eb531);
        width_00 = (bitwidth_t)((ulong)pPVar6 >> 0x20);
        pCVar11 = local_20;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,StreamingAllowed);
        local_48 = Expression::create(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                      in_stack_fffffffffffffea0,in_stack_fffffffffffffeb8,
                                      (Type *)CONCAT44(in_stack_fffffffffffffe9c,
                                                       in_stack_fffffffffffffe98));
        bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffce0);
        if (bVar1) {
          pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                       (Expression *)
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                      );
          return pEVar4;
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x9eb5cf);
        bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffce0);
        if (!bVar1) {
          parsing::Token::location((Token *)(local_18 + 0x20));
          code.code._0_1_ = in_stack_fffffffffffffd06;
          code.subsystem = in_stack_fffffffffffffd04;
          code.code._1_1_ = in_stack_fffffffffffffd07;
          SVar10._4_4_ = in_stack_fffffffffffffcfc;
          SVar10._0_4_ = in_stack_fffffffffffffcf8;
          ASTContext::addDiag((ASTContext *)
                              CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),code,
                              SVar10);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x9eb65a);
          ast::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          range.endLoc._0_4_ = in_stack_fffffffffffffcf0;
          range.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
          range.endLoc._4_4_ = in_stack_fffffffffffffcf4;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range);
          range_00.endLoc._0_4_ = in_stack_fffffffffffffcf0;
          range_00.startLoc = (SourceLocation)in_stack_fffffffffffffce8;
          range_00.endLoc._4_4_ = in_stack_fffffffffffffcf4;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffce0,range_00);
          pEVar4 = Expression::badExpr(in_stack_fffffffffffffce0,
                                       (Expression *)
                                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8)
                                      );
          return pEVar4;
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x9eb72c);
        Type::getIntegralFlags(in_stack_fffffffffffffce8);
        local_40 = (SourceLocation)Compilation::getType(pCVar11,width_00,flags);
        goto LAB_009eb75f;
      }
    }
    local_8 = (ConversionExpression *)
              Expression::badExpr(in_stack_fffffffffffffce0,
                                  (Expression *)
                                  CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& comp, const CastExpressionSyntax& syntax,
                                             const ASTContext& context,
                                             const Type* assignmentTarget) {
    auto& targetExpr = bind(*syntax.left, context, ASTFlags::AllowDataType);
    if (targetExpr.bad())
        return badExpr(comp, nullptr);

    auto type = &comp.getErrorType();
    Expression* operand;
    if (targetExpr.kind == ExpressionKind::DataType) {
        type = targetExpr.type;
        if (!type->isSimpleType() && !type->isError() && !type->isString() &&
            syntax.left->kind != SyntaxKind::TypeReference) {
            context.addDiag(diag::BadCastType, targetExpr.sourceRange) << *type;
            return badExpr(comp, nullptr);
        }

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed, type);
        if (operand->bad())
            return badExpr(comp, nullptr);
    }
    else {
        auto val = context.evalInteger(targetExpr);
        if (!val || !context.requireGtZero(val, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        bitwidth_t width = bitwidth_t(*val);
        if (!context.requireValidBitWidth(width, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed);
        if (operand->bad())
            return badExpr(comp, nullptr);

        if (!operand->type->isIntegral()) {
            auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
            diag << *operand->type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, nullptr);
        }

        type = &comp.getType(width, operand->type->getIntegralFlags());
    }

    auto result = [&](ConversionKind cast = ConversionKind::Explicit) {
        return comp.emplace<ConversionExpression>(*type, cast, *operand, syntax.sourceRange());
    };

    if (!type->isCastCompatible(*operand->type)) {
        if (!Bitstream::checkClassAccess(*type, context, targetExpr.sourceRange)) {
            return badExpr(comp, result());
        }

        if (operand->kind == ExpressionKind::Streaming) {
            if (!Bitstream::isBitstreamCast(*type,
                                            operand->as<StreamingConcatenationExpression>())) {
                auto& diag = context.addDiag(diag::BadStreamCast, syntax.apostrophe.location());
                diag << *type;
                diag << targetExpr.sourceRange << operand->sourceRange;
                return badExpr(comp, result());
            }
        }
        else if (!type->isBitstreamCastable(*operand->type)) {
            auto& diag = context.addDiag(diag::BadConversion, syntax.apostrophe.location());
            diag << *operand->type << *type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, result());
        }
        else if (!Bitstream::checkClassAccess(*operand->type, context, operand->sourceRange)) {
            return badExpr(comp, result());
        }

        return *result(ConversionKind::BitstreamCast);
    }

    // We have a useless cast if the type of the operand matches what we're casting to, unless:
    // - We needed the assignment-like context of the cast (like for an unpacked array concat)
    // - We weren't already in an assignment-like context of the correct type
    // - We're casting a genvar (people dislike seeing warnings about genvar operands)
    // - We're casting to a different typedef even if it's a matching underlying type
    auto isGenvar = [&] {
        if (auto sym = operand->getSymbolReference()) {
            return sym->kind == SymbolKind::Genvar || (sym->kind == SymbolKind::Parameter &&
                                                       sym->as<ParameterSymbol>().isFromGenvar());
        }
        return false;
    };

    auto isDifferentTypedef = [&] {
        return (type->isAlias() || operand->type->isAlias()) && type != operand->type;
    };

    if (type->isMatching(*operand->type) && !isGenvar() && !isDifferentTypedef() &&
        ((assignmentTarget && assignmentTarget->isMatching(*type) &&
          operand->kind != ExpressionKind::ConditionalOp) ||
         !actuallyNeededCast(*type, *operand))) {
        context.addDiag(diag::UselessCast, syntax.apostrophe.location())
            << *operand->type << targetExpr.sourceRange << operand->sourceRange;
    }

    if (type->isAssignmentCompatible(*operand->type)) {
        // The type we propagate should use the sign of the operand, just like it
        // would if we were doing an implicit conversion via an assignment expression.
        auto propagatedType = type;
        if (type->isNumeric() && operand->type->isNumeric()) {
            propagatedType = OpInfo::binaryType(comp, type, operand->type, false,
                                                /* signednessFromRt */ true);
        }

        contextDetermined(context, operand, nullptr, *propagatedType, syntax.apostrophe.range(),
                          ConversionKind::Explicit);

        if (operand->kind == ExpressionKind::Conversion &&
            !operand->as<ConversionExpression>().isImplicit()) {
            operand->sourceRange = syntax.sourceRange();
            operand->type = type;
            return *operand;
        }
    }
    else {
        selfDetermined(context, operand);
    }

    return *result();
}